

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

char * __thiscall CStorage::ReadFileStr(CStorage *this,char *pFilename,int Type)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  IOHANDLE io;
  
  iVar1 = (*(this->super_IStorage).super_IInterface._vptr_IInterface[4])
                    (this,pFilename,9,Type,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar1);
  if (io == (IOHANDLE)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = io_read_all_str(io);
    io_close(io);
  }
  return pcVar2;
}

Assistant:

char *ReadFileStr(const char *pFilename, int Type)
	{
		IOHANDLE File = OpenFile(pFilename, IOFLAG_READ | IOFLAG_SKIP_BOM, Type);
		if(!File)
		{
			return 0;
		}
		char *pResult = io_read_all_str(File);
		io_close(File);
		return pResult;
	}